

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

size_t __thiscall
Memory::HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::
GetEmptyHeapBlockCount
          (HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *pSVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  pSVar4 = this->emptyBlockList;
  if (pSVar4 == (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar2 = 1;
    do {
      uVar6 = uVar2;
      this_00 = (pSVar4->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
      if (this_00 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar4 = HeapBlock::AsLeafBlock<SmallAllocationBlockAttributes>(&this_00->super_HeapBlock);
      uVar2 = uVar6 + 1;
    } while (pSVar4 != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0);
  }
  if (uVar6 != (this->super_HeapBucket).emptyHeapBlockCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1d6,"(count == this->emptyHeapBlockCount)",
                       "count == this->emptyHeapBlockCount");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return uVar6;
}

Assistant:

size_t
HeapBucketT<TBlockType>::GetEmptyHeapBlockCount() const
{
    size_t count = HeapBlockList::Count(this->emptyBlockList);
    RECYCLER_SLOW_CHECK(Assert(count == this->emptyHeapBlockCount));
    return count;
}